

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmList.cxx
# Opt level: O0

void __thiscall
anon_unknown.dwarf_399f32::TransformNoSelector::~TransformNoSelector(TransformNoSelector *this)

{
  TransformNoSelector *this_local;
  
  ~TransformNoSelector(this);
  operator_delete(this,0x28);
  return;
}

Assistant:

TransformNoSelector()
    : TransformSelector("NO SELECTOR")
  {
  }